

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

bool Js::InitializeFunctionDeferredTypeHandlerFilter<true,_false,_true>::HasProperty
               (PropertyId propertyId)

{
  undefined1 local_9;
  PropertyId propertyId_local;
  
  if (propertyId == 0xd1) {
    local_9 = true;
  }
  else if (propertyId == 0x106) {
    local_9 = true;
  }
  else if (propertyId == 0x124) {
    local_9 = false;
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

static bool HasProperty(PropertyId propertyId)
        {
            switch (propertyId)
            {
            case PropertyIds::prototype:
                return isPrototypeAvailable;
            case PropertyIds::name:
                return isNameAvailable;
            case PropertyIds::length:
                return isLengthAvailable;
            }
            return false;
        }